

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (LazySerializerEmitter *this,FieldDescriptor *field)

{
  int iVar1;
  bool bVar2;
  OneofDescriptor *pOVar3;
  char *pcVar4;
  reference pvVar5;
  int __c;
  FieldDescriptor *in_RSI;
  FieldDescriptor *__s;
  LazySerializerEmitter *in_RDI;
  int new_index;
  int has_bit_index;
  int *in_stack_00000080;
  char *in_stack_00000088;
  Formatter *in_stack_00000090;
  int in_stack_0000013c;
  FieldDescriptor *in_stack_00000140;
  Printer *in_stack_00000148;
  MessageGenerator *in_stack_00000150;
  LazySerializerEmitter *in_stack_ffffffffffffffd0;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  __s = in_RSI;
  if (((in_RDI->eager_ & 1U) != 0) ||
     (bVar2 = MustFlush(google::protobuf::FieldDescriptor_const__
                        (in_RDI,(FieldDescriptor *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
     bVar2)) {
    GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush(in_stack_ffffffffffffffd0);
  }
  pOVar3 = FieldDescriptor::containing_oneof(in_RSI);
  if (pOVar3 == (OneofDescriptor *)0x0) {
    FieldDescriptor::options(in_RSI);
    bVar2 = FieldOptions::weak((FieldOptions *)0x50a053);
    if (((!bVar2) && (bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x50a065), !bVar2)) &&
       ((in_RDI->eager_ & 1U) == 0)) {
      this_00 = &in_RDI->mg_->has_bit_indices_;
      pcVar4 = FieldDescriptor::index(in_RSI,(char *)__s,__c);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(int)pcVar4);
      iVar1 = *pvVar5;
      if (in_RDI->cached_has_bit_index_ != iVar1 / 0x20) {
        Formatter::operator()(in_stack_00000090,in_stack_00000088,in_stack_00000080);
        in_RDI->cached_has_bit_index_ = iVar1 / 0x20;
      }
    }
    Formatter::printer(&in_RDI->format_);
    GenerateSerializeOneField
              (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_0000013c);
  }
  else {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)in_RDI,
                (value_type *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (field->containing_oneof() == NULL) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            format_("cached_has_bits = _has_bits_[$1$];\n", new_index);

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(format_.printer(), field,
                                       cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }